

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_open_raw(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_rcdesc rc;
  vm_rcdesc local_60;
  
  CVmMetaclass::get_class_obj(metaclass_reg_);
  vm_rcdesc::init(&local_60,(EVP_PKEY_CTX *)"File.openRawFile");
  open_binary(retval,argc,3,0,&local_60);
  return 1;
}

Assistant:

int CVmObjFile::getp_open_raw(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    vm_rcdesc rc(vmg_ "File.openRawFile",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_OPEN_RAW, G_stk->get(0), argc);
    return s_getp_open_raw(vmg_ retval, argc, FALSE, &rc);
}